

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypePrimitiveWriter.cpp
# Opt level: O3

EStatusCode __thiscall
TrueTypePrimitiveWriter::WriteBYTE(TrueTypePrimitiveWriter *this,Byte inValue)

{
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  Byte local_9;
  
  EVar1 = eFailure;
  if (this->mInternalState != eFailure) {
    local_9 = inValue;
    iVar2 = (*(this->mTrueTypeFile->super_IByteWriterWithPosition).super_IByteWriter.
              _vptr_IByteWriter[2])(this->mTrueTypeFile,&local_9,1);
    EVar1 = eSuccess;
    if (CONCAT44(extraout_var,iVar2) != 1) {
      this->mInternalState = eFailure;
      EVar1 = eFailure;
    }
  }
  return EVar1;
}

Assistant:

EStatusCode TrueTypePrimitiveWriter::WriteBYTE(Byte inValue)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mTrueTypeFile->Write(&inValue,1) == 1 ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}